

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O3

Unr_Man_t * Unr_ManAlloc(Gia_Man_t *pGia)

{
  int iVar1;
  char *__s;
  Unr_Man_t *pUVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Gia_Man_t *p;
  char *__dest;
  int iVar5;
  size_t sVar6;
  
  pUVar2 = (Unr_Man_t *)calloc(1,0x68);
  pUVar2->pGia = pGia;
  iVar1 = pGia->nObjs;
  pUVar2->nObjs = iVar1;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar5;
  if (iVar5 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar5 * 4);
  }
  pVVar3->pArray = piVar4;
  pUVar2->vOrder = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(400);
  pVVar3->pArray = piVar4;
  pUVar2->vOrderLim = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = iVar5;
  if (iVar5 == 0) {
    pVVar3->pArray = (int *)0x0;
    pVVar3->nSize = iVar1;
    pUVar2->vTents = pVVar3;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    pVVar3->nCap = 0;
    pVVar3->pArray = (int *)0x0;
    pVVar3->nSize = iVar1;
  }
  else {
    sVar6 = (long)iVar5 << 2;
    piVar4 = (int *)malloc(sVar6);
    pVVar3->pArray = piVar4;
    pVVar3->nSize = iVar1;
    if (piVar4 != (int *)0x0) {
      memset(piVar4,0xff,(long)iVar1 * 4);
    }
    pUVar2->vTents = pVVar3;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    pVVar3->nCap = iVar5;
    piVar4 = (int *)malloc(sVar6);
    pVVar3->pArray = piVar4;
    pVVar3->nSize = iVar1;
    if (piVar4 != (int *)0x0) {
      memset(piVar4,0,(long)iVar1 << 2);
    }
  }
  pUVar2->vRanks = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(400);
  pVVar3->pArray = piVar4;
  pUVar2->vObjLim = pVVar3;
  iVar1 = pGia->vCis->nSize;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  if (iVar1 - 1U < 0xf) {
    iVar1 = 0x10;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar1;
  if (iVar1 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar1 << 2);
  }
  pVVar3->pArray = piVar4;
  pUVar2->vCiMap = pVVar3;
  iVar1 = pGia->vCos->nSize;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar5;
  if (iVar5 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar5 << 2);
  }
  pVVar3->pArray = piVar4;
  pUVar2->vCoMap = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 10000;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(40000);
  pVVar3->pArray = piVar4;
  pUVar2->vPiLits = pVVar3;
  p = Gia_ManStart(10000);
  pUVar2->pFrames = p;
  __s = pGia->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar6 = strlen(__s);
    __dest = (char *)malloc(sVar6 + 1);
    strcpy(__dest,__s);
  }
  p->pName = __dest;
  Gia_ManHashStart(p);
  return pUVar2;
}

Assistant:

Unr_Man_t * Unr_ManAlloc( Gia_Man_t * pGia )
{
    Unr_Man_t * p;
    p = ABC_CALLOC( Unr_Man_t, 1 );
    p->pGia      = pGia;
    p->nObjs     = Gia_ManObjNum(pGia);
    p->vOrder    = Vec_IntAlloc( p->nObjs );
    p->vOrderLim = Vec_IntAlloc( 100 );
    p->vTents    = Vec_IntStartFull( p->nObjs );
    p->vRanks    = Vec_IntStart( p->nObjs );
    p->vObjLim   = Vec_IntAlloc( 100 );
    p->vCiMap    = Vec_IntAlloc( Gia_ManCiNum(pGia) );
    p->vCoMap    = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    p->vPiLits   = Vec_IntAlloc( 10000 );
    p->pFrames   = Gia_ManStart( 10000 );
    p->pFrames->pName = Abc_UtilStrsav( pGia->pName );
    Gia_ManHashStart( p->pFrames );
    return p;
}